

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void __thiscall TestMaterial::RandomTestSupportFunction(TestMaterial *this)

{
  long *plVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  void *__s;
  time_t tVar12;
  void *__s_00;
  clock_t cVar13;
  clock_t cVar14;
  ostream *poVar15;
  long lVar16;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"RandomTestSupportFunction",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  __s = operator_new(24000000);
  memset(__s,0,24000000);
  tVar12 = time((time_t *)0x0);
  srand((uint)tVar12);
  __s_00 = operator_new(24000000);
  memset(__s_00,0,24000000);
  lVar16 = 0x10;
  do {
    iVar8 = rand();
    iVar9 = rand();
    iVar10 = rand();
    iVar11 = rand();
    dVar2 = log((double)iVar8 / 2147483647.0);
    dVar2 = dVar2 * -2.0;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    dVar3 = cos(((double)iVar9 / 2147483647.0) * 6.283185307179586);
    dVar4 = log((double)iVar9 / 2147483647.0);
    dVar4 = dVar4 * -2.0;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar5 = cos(((double)iVar8 / 2147483647.0) * 6.283185307179586);
    dVar6 = log((double)iVar10 / 2147483647.0);
    dVar6 = dVar6 * -2.0;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar7 = cos(((double)iVar11 / 2147483647.0) * 6.283185307179586);
    *(double *)((long)__s_00 + lVar16 + -0x10) = dVar2 * dVar3;
    *(double *)((long)__s_00 + lVar16 + -8) = dVar4 * dVar5;
    *(double *)((long)__s_00 + lVar16) = dVar7 * dVar6;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x16e3610);
  lVar16 = 0;
  cVar13 = clock();
  do {
    plVar1 = *(long **)(*(long *)&this->field_0x8 + (ulong)this->CurrentObj * 8);
    (**(code **)(*plVar1 + 0x20))(&local_48,plVar1,(long)__s_00 + lVar16);
    *(undefined8 *)((long)__s + lVar16 + 0x10) = local_38;
    *(undefined8 *)((long)__s + lVar16) = local_48;
    ((undefined8 *)((long)__s + lVar16))[1] = uStack_40;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 24000000);
  cVar14 = clock();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  computation time: ",0x14);
  poVar15 = std::ostream::_M_insert<double>((double)(cVar14 - cVar13) / 1000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
  std::ostream::put((char)poVar15);
  std::ostream::flush();
  operator_delete(__s_00,24000000);
  operator_delete(__s,24000000);
  return;
}

Assistant:

void TestMaterial::RandomTestSupportFunction()
{
  std::cout << "RandomTestSupportFunction" << std::endl;
  std::vector<Vector3> supportVector(RandomTestEnd);

  clock_t begin, end;
  srand(static_cast<unsigned int>(time(NULL)));



  std::vector<Vector3> v(RandomTestEnd);

  for (long j=0; j<RandomTestEnd; j++)
  {

    double a = (rand()/double(RAND_MAX)) ;
    double b = (rand()/double(RAND_MAX)) ;
    double c = (rand()/double(RAND_MAX)) ;
    double d = (rand()/double(RAND_MAX)) ;

    v[j]=Vector3(sqrt(-2*log(a))*cos(2*PI*b),sqrt(-2*log(b))*cos(2*PI*a),sqrt(-2*log(c))*cos(2*PI*d));
  }

  begin=clock();

  for (long j=0; j<RandomTestEnd; j++)
  {
#ifdef DO_TEST
    supportVector[j] = sObj[CurrentObj]->support(v[j]);
#endif
  }

  end=clock();

  std::cout << "  computation time: " << ((double)(end- begin) / CLOCKS_PER_SEC) <<  std::endl;

  // print the data in a file
#ifdef OUTPUT_FILE
  std::fstream outfile;
  outfile.open("/tmp/sch_randomtestsupport_result.txt",std::ios_base::out|std::ios_base::trunc);
  outfile.precision(18);
  for (long j=0; j<RandomTestEnd; j++)
    outfile<< supportVector[j] <<std::endl;
  outfile.close();
#endif // OUTPUT_FILE
}